

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O2

Gia_Man_t * Acec_CommonStart(Gia_Man_t *pBase,Gia_Man_t *pAdd)

{
  Vec_Int_t *p;
  ulong uVar1;
  int iVar2;
  uint uVar3;
  int iLit1;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  char *pcVar6;
  int iVar7;
  
  Gia_ManFillValue(pAdd);
  pAdd->pObjs->Value = 0;
  if (pBase == (Gia_Man_t *)0x0) {
    pBase = Gia_ManStart(pAdd->nObjs);
    pcVar6 = Abc_UtilStrsav(pAdd->pName);
    pBase->pName = pcVar6;
    pcVar6 = Abc_UtilStrsav(pAdd->pSpec);
    pBase->pSpec = pcVar6;
    iVar2 = 0;
    while ((iVar2 < pAdd->vCis->nSize &&
           (pGVar4 = Gia_ManCi(pAdd,iVar2), pGVar4 != (Gia_Obj_t *)0x0))) {
      pGVar5 = Gia_ManAppendObj(pBase);
      uVar1 = *(ulong *)pGVar5;
      *(ulong *)pGVar5 = uVar1 | 0x9fffffff;
      *(ulong *)pGVar5 =
           uVar1 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(pBase->vCis->nSize & 0x1fffffff) << 0x20;
      p = pBase->vCis;
      iVar7 = Gia_ObjId(pBase,pGVar5);
      Vec_IntPush(p,iVar7);
      iVar7 = Gia_ObjId(pBase,pGVar5);
      pGVar4->Value = iVar7 * 2;
      iVar2 = iVar2 + 1;
    }
    Gia_ManHashAlloc(pBase);
  }
  else {
    iVar2 = pBase->vCis->nSize;
    if (iVar2 != pAdd->vCis->nSize) {
      __assert_fail("Gia_ManCiNum(pBase) == Gia_ManCiNum(pAdd)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCore.c"
                    ,0xa5,"Gia_Man_t *Acec_CommonStart(Gia_Man_t *, Gia_Man_t *)");
    }
    iVar7 = 0;
    while ((iVar7 < iVar2 && (pGVar4 = Gia_ManCi(pAdd,iVar7), pGVar4 != (Gia_Obj_t *)0x0))) {
      pGVar5 = Gia_ManCi(pBase,iVar7);
      iVar2 = Gia_ObjId(pBase,(Gia_Obj_t *)((ulong)pGVar5 & 0xfffffffffffffffe));
      uVar3 = Abc_Var2Lit(iVar2,(uint)pGVar5 & 1);
      pGVar4->Value = uVar3;
      iVar7 = iVar7 + 1;
      iVar2 = pAdd->vCis->nSize;
    }
  }
  iVar2 = 0;
  while( true ) {
    if (pAdd->nObjs <= iVar2) {
      return pBase;
    }
    pGVar4 = Gia_ManObj(pAdd,iVar2);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar1 = *(ulong *)pGVar4;
    if ((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar1) {
      iVar7 = Abc_LitNotCond(pGVar4[-(uVar1 & 0x1fffffff)].Value,(uint)(uVar1 >> 0x1d) & 1);
      uVar3 = (uint)((ulong)*(undefined8 *)pGVar4 >> 0x20);
      iLit1 = Abc_LitNotCond(pGVar4[-(ulong)(uVar3 & 0x1fffffff)].Value,uVar3 >> 0x1d & 1);
      uVar3 = Gia_ManHashAnd(pBase,iVar7,iLit1);
      pGVar4->Value = uVar3;
    }
    iVar2 = iVar2 + 1;
  }
  return pBase;
}

Assistant:

Gia_Man_t * Acec_CommonStart( Gia_Man_t * pBase, Gia_Man_t * pAdd )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( pAdd );
    Gia_ManConst0(pAdd)->Value = 0;
    if ( pBase == NULL )
    {
        pBase = Gia_ManStart( Gia_ManObjNum(pAdd) );
        pBase->pName = Abc_UtilStrsav( pAdd->pName );
        pBase->pSpec = Abc_UtilStrsav( pAdd->pSpec );
        Gia_ManForEachCi( pAdd, pObj, i )
            pObj->Value = Gia_ManAppendCi(pBase);
        Gia_ManHashAlloc( pBase );
    }
    else
    {
        assert( Gia_ManCiNum(pBase) == Gia_ManCiNum(pAdd) );
        Gia_ManForEachCi( pAdd, pObj, i )
            pObj->Value = Gia_Obj2Lit( pBase, Gia_ManCi(pBase, i) );
    }
    Gia_ManForEachAnd( pAdd, pObj, i )
        pObj->Value = Gia_ManHashAnd( pBase, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    return pBase;
}